

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::ScaleParameter::ScaleParameter(ScaleParameter *this,ScaleParameter *from)

{
  bool bVar1;
  InternalMetadataWithArena *this_00;
  FillerParameter *pFVar2;
  ScaleParameter *from_local;
  ScaleParameter *this_local;
  Container *local_28;
  
  google::protobuf::Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__ScaleParameter_00d4ffa0;
  google::protobuf::internal::InternalMetadataWithArena::InternalMetadataWithArena
            (&this->_internal_metadata_,(Arena *)0x0);
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      local_28 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_00);
    }
    else {
      local_28 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArena::default_instance();
    }
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,&local_28->unknown_fields);
  }
  bVar1 = has_filler(from);
  if (bVar1) {
    pFVar2 = (FillerParameter *)operator_new(0x40);
    FillerParameter::FillerParameter(pFVar2,from->filler_);
    this->filler_ = pFVar2;
  }
  else {
    this->filler_ = (FillerParameter *)0x0;
  }
  bVar1 = has_bias_filler(from);
  if (bVar1) {
    pFVar2 = (FillerParameter *)operator_new(0x40);
    FillerParameter::FillerParameter(pFVar2,from->bias_filler_);
    this->bias_filler_ = pFVar2;
  }
  else {
    this->bias_filler_ = (FillerParameter *)0x0;
  }
  memcpy(&this->bias_term_,&from->bias_term_,0xc);
  return;
}

Assistant:

ScaleParameter::ScaleParameter(const ScaleParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_filler()) {
    filler_ = new ::caffe::FillerParameter(*from.filler_);
  } else {
    filler_ = NULL;
  }
  if (from.has_bias_filler()) {
    bias_filler_ = new ::caffe::FillerParameter(*from.bias_filler_);
  } else {
    bias_filler_ = NULL;
  }
  ::memcpy(&bias_term_, &from.bias_term_,
    reinterpret_cast<char*>(&num_axes_) -
    reinterpret_cast<char*>(&bias_term_) + sizeof(num_axes_));
  // @@protoc_insertion_point(copy_constructor:caffe.ScaleParameter)
}